

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::ComputeNormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               string *err)

{
  uint uVar1;
  float3 v1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  const_reference pvVar7;
  reference pvVar8;
  float3 fVar9;
  undefined8 local_ac8;
  float local_ac0;
  ulong local_aa8;
  size_t v_1;
  float local_a98;
  float3 local_a8c;
  string local_a80 [32];
  size_type local_a60;
  allocator local_a51;
  string local_a50;
  string local_a30;
  ostringstream local_a10 [8];
  ostringstream ss_e_4;
  ulong uStack_890;
  uint32_t vidx;
  size_t v;
  float local_880;
  undefined1 local_818 [8];
  float3 Nf;
  float area;
  size_type local_7e8;
  allocator local_7d9;
  string local_7d8 [32];
  string local_7b8;
  ostringstream local_798 [8];
  ostringstream ss_e_3;
  string local_620 [32];
  size_type local_600;
  allocator local_5f1;
  string local_5f0 [32];
  string local_5d0;
  ostringstream local_5b0 [8];
  ostringstream ss_e_2;
  string local_438 [32];
  size_type local_418;
  allocator local_409;
  string local_408 [32];
  string local_3e8;
  ostringstream local_3c8 [8];
  ostringstream ss_e_1;
  undefined1 local_24c [8];
  uint32_t vidx2;
  uint32_t vidx1;
  uint32_t vidx0;
  allocator local_219;
  string local_218 [32];
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream ss_e;
  undefined1 local_60 [8];
  size_t nv;
  size_t f;
  size_t faceVertexIndexOffset;
  undefined4 local_40;
  undefined4 local_3c;
  string *local_38;
  string *err_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices_local;
  
  local_38 = err;
  err_local = (string *)normals;
  normals_local =
       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)faceVertexIndices
  ;
  faceVertexIndices_local = faceVertexCounts;
  faceVertexCounts_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)vertices;
  sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                    (vertices);
  faceVertexIndexOffset._4_4_ = 0;
  local_40 = 0;
  local_3c = 0;
  ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
            (normals,sVar3,(value_type *)((long)&faceVertexIndexOffset + 4));
  f = 0;
  nv = 0;
  do {
    sVar2 = nv;
    sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (faceVertexIndices_local);
    if (sVar3 <= sVar2) {
      local_aa8 = 0;
      while( true ) {
        sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     err_local);
        if (sVar3 <= local_aa8) break;
        pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)err_local,local_aa8);
        fVar9 = vnormalize(pvVar8,1.1920929e-07);
        local_ac8 = fVar9._M_elems._0_8_;
        local_ac0 = fVar9._M_elems[2];
        pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                 operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)err_local,local_aa8);
        *(undefined8 *)pvVar8->_M_elems = local_ac8;
        pvVar8->_M_elems[2] = local_ac0;
        local_aa8 = local_aa8 + 1;
      }
      vertices_local._7_1_ = 1;
LAB_004bbcbb:
      return (bool)(vertices_local._7_1_ & 1);
    }
    pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (faceVertexIndices_local,nv);
    local_60 = (undefined1  [8])(ulong)*pvVar4;
    if ((ulong)local_60 < 3) {
      ::std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar5 = ::std::operator<<((ostream *)local_1d8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ComputeNormals");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x8c2);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_218,"Invalid face num {} at faceVertexCounts[{}]",&local_219);
      fmt::format<unsigned_long,unsigned_long>
                (&local_1f8,(fmt *)local_218,(string *)local_60,&nv,(unsigned_long *)err);
      poVar5 = ::std::operator<<((ostream *)local_1d8,(string *)&local_1f8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::__cxx11::string::~string(local_218);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)local_38,(string *)&vidx1);
        ::std::__cxx11::string::~string((string *)&vidx1);
      }
      vertices_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1d8);
      goto LAB_004bbcbb;
    }
    pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)normals_local,f);
    vidx2 = *pvVar4;
    pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)normals_local,f + 1);
    local_24c._4_4_ = *pvVar4;
    pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)normals_local,f + 2);
    local_24c._0_4_ = *pvVar4;
    uVar6 = (ulong)vidx2;
    sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
    if (sVar3 <= uVar6) {
      ::std::__cxx11::ostringstream::ostringstream(local_3c8);
      poVar5 = ::std::operator<<((ostream *)local_3c8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ComputeNormals");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x8cd);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_408,"vertexIndex0 {} exceeds vertices.size {}",&local_409);
      local_418 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
      fmt::format<unsigned_int,unsigned_long>
                (&local_3e8,(fmt *)local_408,(string *)&vidx2,(uint *)&local_418,
                 (unsigned_long *)err);
      poVar5 = ::std::operator<<((ostream *)local_3c8,(string *)&local_3e8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_3e8);
      ::std::__cxx11::string::~string(local_408);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_409);
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)local_38,local_438);
        ::std::__cxx11::string::~string(local_438);
      }
      vertices_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_3c8);
      goto LAB_004bbcbb;
    }
    uVar6 = (ulong)(uint)local_24c._4_4_;
    sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
    if (sVar3 <= uVar6) {
      ::std::__cxx11::ostringstream::ostringstream(local_5b0);
      poVar5 = ::std::operator<<((ostream *)local_5b0,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ComputeNormals");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x8d2);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_5f0,"vertexIndex1 {} exceeds vertices.size {}",&local_5f1);
      local_600 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
      fmt::format<unsigned_int,unsigned_long>
                (&local_5d0,(fmt *)local_5f0,(string *)(local_24c + 4),(uint *)&local_600,
                 (unsigned_long *)err);
      poVar5 = ::std::operator<<((ostream *)local_5b0,(string *)&local_5d0);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_5d0);
      ::std::__cxx11::string::~string(local_5f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)local_38,local_620);
        ::std::__cxx11::string::~string(local_620);
      }
      vertices_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_5b0);
      goto LAB_004bbcbb;
    }
    uVar6 = (ulong)(uint)local_24c._0_4_;
    sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
    if (sVar3 <= uVar6) {
      ::std::__cxx11::ostringstream::ostringstream(local_798);
      poVar5 = ::std::operator<<((ostream *)local_798,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ComputeNormals");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x8d7);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_7d8,"vertexIndex2 {} exceeds vertices.size {}",&local_7d9);
      local_7e8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       faceVertexCounts_local);
      fmt::format<unsigned_int,unsigned_long>
                (&local_7b8,(fmt *)local_7d8,(string *)local_24c,(uint *)&local_7e8,
                 (unsigned_long *)err);
      poVar5 = ::std::operator<<((ostream *)local_798,(string *)&local_7b8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_7b8);
      ::std::__cxx11::string::~string(local_7d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)local_38,(string *)(Nf._M_elems + 2));
        ::std::__cxx11::string::~string((string *)(Nf._M_elems + 2));
      }
      vertices_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_798);
      goto LAB_004bbcbb;
    }
    Nf._M_elems[1] = 0.0;
    pvVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        faceVertexCounts_local,(ulong)vidx2);
    fVar9._M_elems = *&pvVar7->_M_elems;
    pvVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        faceVertexCounts_local,(ulong)(uint)local_24c._4_4_);
    v1._M_elems = *&pvVar7->_M_elems;
    pvVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        faceVertexCounts_local,(ulong)(uint)local_24c._0_4_);
    fVar9 = GeometricNormal(fVar9,v1,*&pvVar7->_M_elems,Nf._M_elems + 1);
    v = fVar9._M_elems._0_8_;
    local_818 = (undefined1  [8])v;
    local_880 = fVar9._M_elems[2];
    Nf._M_elems[0] = local_880;
    for (uStack_890 = 0; uStack_890 < (ulong)local_60; uStack_890 = uStack_890 + 1) {
      pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)normals_local,
                          f + uStack_890);
      uVar1 = *pvVar4;
      sVar3 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                        ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *
                         )faceVertexCounts_local);
      if (sVar3 <= uVar1) {
        ::std::__cxx11::ostringstream::ostringstream(local_a10);
        poVar5 = ::std::operator<<((ostream *)local_a10,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ComputeNormals");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x8e2);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_a50,"vertexIndex exceeds vertices.size {}",&local_a51);
        local_a60 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)faceVertexCounts_local);
        fmt::format<unsigned_long>(&local_a30,&local_a50,&local_a60);
        poVar5 = ::std::operator<<((ostream *)local_a10,(string *)&local_a30);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_a30);
        ::std::__cxx11::string::~string((string *)&local_a50);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a51);
        if (local_38 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)local_38,local_a80);
          ::std::__cxx11::string::~string(local_a80);
        }
        vertices_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a10);
        goto LAB_004bbcbb;
      }
      fVar9 = tinyusdz::operator*(Nf._M_elems[1],(float3 *)local_818);
      v_1 = fVar9._M_elems._0_8_;
      local_a8c._M_elems[0] = (float)(undefined4)v_1;
      local_a8c._M_elems[1] = (float)v_1._4_4_;
      local_a98 = fVar9._M_elems[2];
      local_a8c._M_elems[2] = local_a98;
      pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
               operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           *)err_local,(ulong)uVar1);
      tinyusdz::operator+=(pvVar8,&local_a8c);
    }
    f = (long)local_60 + f;
    nv = nv + 1;
  } while( true );
}

Assistant:

static bool ComputeNormals(const std::vector<vec3> &vertices,
                           const std::vector<uint32_t> &faceVertexCounts,
                           const std::vector<uint32_t> &faceVertexIndices,
                           std::vector<vec3> &normals, std::string *err) {
  normals.assign(vertices.size(), {0.0f, 0.0f, 0.0f});

  size_t faceVertexIndexOffset{0};
  for (size_t f = 0; f < faceVertexCounts.size(); f++) {
    size_t nv = faceVertexCounts[f];

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid face num {} at faceVertexCounts[{}]", nv, f));
    }

    // For quad/polygon, first three vertices are used to compute face normal
    // (Assume quad/polygon plane is co-planar)
    uint32_t vidx0 = faceVertexIndices[faceVertexIndexOffset + 0];
    uint32_t vidx1 = faceVertexIndices[faceVertexIndexOffset + 1];
    uint32_t vidx2 = faceVertexIndices[faceVertexIndexOffset + 2];

    if (vidx0 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex0 {} exceeds vertices.size {}", vidx0, vertices.size()));
    }

    if (vidx1 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex1 {} exceeds vertices.size {}", vidx1, vertices.size()));
    }

    if (vidx2 >= vertices.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("vertexIndex2 {} exceeds vertices.size {}", vidx2, vertices.size()));
    }

    float area{0.0f};
    value::float3 Nf = GeometricNormal(vertices[vidx0], vertices[vidx1],
                                       vertices[vidx2], area);

    for (size_t v = 0; v < nv; v++) {
      uint32_t vidx = faceVertexIndices[faceVertexIndexOffset + v];
      if (vidx >= vertices.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "vertexIndex exceeds vertices.size {}", vertices.size()));
      }
      normals[vidx] += area * Nf;
    }

    faceVertexIndexOffset += nv;
  }

  for (size_t v = 0; v < normals.size(); v++) {
    normals[v] = vnormalize(normals[v]);
  }

  return true;
}